

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O2

BOOL __thiscall
Memory::SmallHeapBlockT<SmallAllocationBlockAttributes>::ReassignPages
          (SmallHeapBlockT<SmallAllocationBlockAttributes> *this,Recycler *recycler)

{
  size_t *psVar1;
  HeapBlockType HVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  IdleDecommitPageAllocator *pIVar7;
  char *baseAddress;
  PageSegment *local_30;
  PageSegment *segment;
  
  if ((this->super_HeapBlock).address != (char *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x13b,"(this->address == nullptr)","this->address == nullptr");
    if (!bVar4) goto LAB_00621303;
    *puVar6 = 0;
  }
  if ((this->super_HeapBlock).segment != (Segment *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x13c,"(this->segment == nullptr)","this->segment == nullptr");
    if (!bVar4) {
LAB_00621303:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  pIVar7 = GetPageAllocator(this);
  baseAddress = PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                ::AllocPagesPageAligned(&pIVar7->super_PageAllocator,1,&local_30);
  if (baseAddress != (char *)0x0) {
    psVar1 = &(recycler->autoHeap).uncollectedNewPageCount;
    *psVar1 = *psVar1 + 1;
    HVar2 = (this->super_HeapBlock).heapBlockType;
    if ((HVar2 != SmallLeafBlockType) && (HVar2 != MediumLeafBlockType)) {
      Recycler::VerifyZeroFill(recycler,baseAddress,0x1000);
    }
    BVar5 = SetPage(this,baseAddress,local_30,recycler);
    if (BVar5 != 0) {
      return 1;
    }
    pIVar7 = GetPageAllocator(this);
    PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
    ::SuspendIdleDecommit(&pIVar7->super_PageAllocator);
    ReleasePages(this,recycler);
    pIVar7 = GetPageAllocator(this);
    PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
    ::ResumeIdleDecommit(&pIVar7->super_PageAllocator);
  }
  return 0;
}

Assistant:

BOOL
SmallHeapBlockT<TBlockAttributes>::ReassignPages(Recycler * recycler)
{
    Assert(this->address == nullptr);
    Assert(this->segment == nullptr);

    PageSegment * segment;

    auto pageAllocator = this->GetPageAllocator();
    uint pagecount = this->GetPageCount();
    char * address = pageAllocator->AllocPagesPageAligned(pagecount, &segment);

    if (address == NULL)
    {
        return FALSE;
    }

#if ENABLE_PARTIAL_GC
    recycler->autoHeap.uncollectedNewPageCount += this->GetPageCount();
#endif
#ifdef RECYCLER_ZERO_MEM_CHECK
    if (!this->IsLeafBlock()
#ifdef RECYCLER_WRITE_BARRIER_ALLOC_THREAD_PAGE
        && !this->IsWithBarrier()
#endif
        )
    {
        recycler->VerifyZeroFill(address, AutoSystemInfo::PageSize * this->GetPageCount());
    }
#endif

    if (!this->SetPage(address, segment, recycler))
    {
        this->GetPageAllocator()->SuspendIdleDecommit();
        this->ReleasePages(recycler);
        this->GetPageAllocator()->ResumeIdleDecommit();
        return FALSE;
    }

    RECYCLER_PERF_COUNTER_ADD(FreeObjectSize, this->GetPageCount() * AutoSystemInfo::PageSize);
    RECYCLER_PERF_COUNTER_ADD(SmallHeapBlockFreeObjectSize, this->GetPageCount() * AutoSystemInfo::PageSize);
    return TRUE;
}